

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkLogicHasSimpleCos(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  uint uVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  char *__s2;
  int i;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x3b1,"int Abc_NtkLogicHasSimpleCos(Abc_Ntk_t *)");
  }
  Abc_NtkIncrementTravId(pNtk);
  i = 0;
  while( true ) {
    if (pNtk->vCos->nSize <= i) {
      return 1;
    }
    pAVar4 = Abc_NtkCo(pNtk,i);
    if ((pAVar4->field_0x15 & 4) != 0) break;
    pAVar1 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
    uVar2 = *(uint *)&pAVar1->field_0x14 & 0xf;
    if ((uVar2 == 5) || (uVar2 == 2)) {
      pcVar5 = Abc_ObjName(pAVar1);
      __s2 = Abc_ObjName(pAVar4);
      iVar3 = strcmp(pcVar5,__s2);
      if (iVar3 != 0) {
        return 0;
      }
    }
    iVar3 = Abc_NodeIsTravIdCurrent(pAVar1);
    if (iVar3 == 0) {
      pAVar4 = (Abc_Obj_t *)Abc_ObjName(pAVar4);
      pAVar1->pNext = pAVar4;
      Abc_NodeSetTravIdCurrent(pAVar1);
    }
    else {
      pAVar1 = pAVar1->pNext;
      pcVar5 = Abc_ObjName(pAVar4);
      iVar3 = strcmp((char *)pAVar1,pcVar5);
      if (iVar3 != 0) {
        return 0;
      }
    }
    i = i + 1;
  }
  return 0;
}

Assistant:

int Abc_NtkLogicHasSimpleCos( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pDriver;
    int i;
    assert( Abc_NtkIsLogic(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        // if the driver is complemented, this is an error
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjFaninC0(pNode) )
            return 0;
        // if the driver is a CI and has different name, this is an error
        if ( Abc_ObjIsCi(pDriver) && strcmp(Abc_ObjName(pDriver), Abc_ObjName(pNode)) )
            return 0;
        // if the driver is visited for the first time, remember the CO name
        if ( !Abc_NodeIsTravIdCurrent(pDriver) )
        {
            pDriver->pNext = (Abc_Obj_t *)Abc_ObjName(pNode);
            Abc_NodeSetTravIdCurrent(pDriver);
            continue;
        }
        // the driver has second CO - if they have different name, this is an error
        if ( strcmp((char *)pDriver->pNext, Abc_ObjName(pNode)) ) // diff names
            return 0;
    }
    return 1;
}